

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O1

void sysbvm_stackFrame_prepareUnwindingUntil(sysbvm_stackFrameRecord_t *targetRecord)

{
  sysbvm_stackFrameCleanupRecord_t *cleanupRecord;
  sysbvm_stackFrameRecord_s *psVar1;
  sysbvm_stackFrameRecord_t *psVar2;
  long *in_FS_OFFSET;
  
  psVar2 = (sysbvm_stackFrameRecord_t *)(*in_FS_OFFSET + -0x10);
  do {
    psVar2 = psVar2->previous;
    if (psVar2 == (sysbvm_stackFrameRecord_t *)0x0) {
      return;
    }
    in_FS_OFFSET[-2] = (long)targetRecord;
    switch(targetRecord->type) {
    case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
      psVar1 = targetRecord[2].previous;
      goto LAB_0013781e;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET:
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET:
      psVar1 = targetRecord[1].previous;
LAB_0013781e:
      if (psVar1 != (sysbvm_stackFrameRecord_s *)0x0) {
        sysbvm_analysisAndEvaluationEnvironment_clearUnwindingRecords
                  ((sysbvm_context_t *)in_FS_OFFSET[-3],(sysbvm_tuple_t)psVar1);
      }
      break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP:
      psVar1 = targetRecord[1].previous;
      if (psVar1 != (sysbvm_stackFrameRecord_s *)0x0) {
        in_FS_OFFSET[-2] = (long)targetRecord->previous;
        sysbvm_function_apply
                  ((sysbvm_context_t *)in_FS_OFFSET[-3],(sysbvm_tuple_t)psVar1,0,
                   (sysbvm_tuple_t *)0x0,1);
      }
    }
    if (psVar2 == targetRecord) {
      return;
    }
  } while( true );
}

Assistant:

static void sysbvm_stackFrame_prepareUnwindingUntil(sysbvm_stackFrameRecord_t *targetRecord)
{
    for(sysbvm_stackFrameRecord_t *position = sysbvm_stackFrame_activeRecord; position; position = position->previous)
    {
        sysbvm_stackFrame_prepareUnwinding(targetRecord);
        if(position == targetRecord)
            return;
    }
}